

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMemPool.c
# Opt level: O2

MemPage * MemPage_create(size_t capacity)

{
  MemPage *pMVar1;
  
  pMVar1 = (MemPage *)deMalloc(capacity + 0x10);
  if (pMVar1 != (MemPage *)0x0) {
    pMVar1->capacity = 0;
    pMVar1->bytesAllocated = 0;
    pMVar1->nextPage = (MemPage *)0x0;
    pMVar1->capacity = (int)capacity;
  }
  return pMVar1;
}

Assistant:

static MemPage* MemPage_create (size_t capacity)
{
	MemPage* page = (MemPage*)deMalloc(sizeof(MemPage) + capacity);
	if (!page)
		return DE_NULL;

	DE_ASSERT(deIsAlignedPtr(page+1, MEM_PAGE_BASE_ALIGN));

	MemPage_init(page, capacity);
	return page;
}